

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O0

void __thiscall gmath::SMatrix<long,_2,_3>::SMatrix(SMatrix<long,_2,_3> *this)

{
  int i_1;
  int n;
  int i;
  int k;
  SMatrix<long,_2,_3> *this_local;
  
  for (k = 0; k < 2; k = k + 1) {
    for (i = 0; i < 3; i = i + 1) {
      this->v[k][i] = 0;
    }
  }
  for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
    this->v[i_1][i_1] = 1;
  }
  return;
}

Assistant:

SMatrix()
    {
      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          v[k][i]=0;
        }

      int n=nrows;

      if (ncols < nrows)
      {
        n=ncols;
      }

      for (int i=0; i<n; i++)
      {
        v[i][i]=1;
      }
    }